

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O1

cmStateSnapshot * __thiscall
cmStateSnapshot::GetCallStackBottom(cmStateSnapshot *__return_storage_ptr__,cmStateSnapshot *this)

{
  SnapshotType SVar1;
  bool bVar2;
  PointerType pSVar3;
  iterator other;
  iterator other_00;
  PositionType pos;
  iterator local_38;
  
  if (this->State == (cmState *)0x0) {
    __assert_fail("this->State",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmStateSnapshot.cxx"
                  ,0x75,"cmStateSnapshot cmStateSnapshot::GetCallStackBottom() const");
  }
  other.Tree = &this->State->SnapshotData;
  other.Position = 0;
  bVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator!=(&this->Position,other)
  ;
  if (bVar2) {
    local_38.Tree = (this->Position).Tree;
    local_38.Position = (this->Position).Position;
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_38);
    SVar1 = pSVar3->SnapshotType;
    while (((SVar1 != BaseType &&
            (pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_38)
            , pSVar3->SnapshotType != BuildsystemDirectoryType)) &&
           (other_00.Tree = &this->State->SnapshotData, other_00.Position = 0,
           bVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator!=
                             (&local_38,other_00), bVar2))) {
      cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator++(&local_38);
      pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_38);
      SVar1 = pSVar3->SnapshotType;
    }
    __return_storage_ptr__->State = this->State;
    (__return_storage_ptr__->Position).Tree = local_38.Tree;
    (__return_storage_ptr__->Position).Position = local_38.Position;
    return __return_storage_ptr__;
  }
  __assert_fail("this->Position != this->State->SnapshotData.Root()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmStateSnapshot.cxx"
                ,0x76,"cmStateSnapshot cmStateSnapshot::GetCallStackBottom() const");
}

Assistant:

cmStateSnapshot cmStateSnapshot::GetCallStackBottom() const
{
  assert(this->State);
  assert(this->Position != this->State->SnapshotData.Root());

  cmStateDetail::PositionType pos = this->Position;
  while (pos->SnapshotType != cmStateEnums::BaseType &&
         pos->SnapshotType != cmStateEnums::BuildsystemDirectoryType &&
         pos != this->State->SnapshotData.Root()) {
    ++pos;
  }
  return { this->State, pos };
}